

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiListClipper::Begin(ImGuiListClipper *this,int count,float items_height)

{
  float fVar1;
  float fVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  ImGuiColumns *pIVar5;
  ImGuiContext *pIVar6;
  uint uVar7;
  float fVar8;
  
  this->StartPosY = (GImGui->CurrentWindow->DC).CursorPos.y;
  this->ItemsHeight = items_height;
  this->ItemsCount = count;
  this->StepNo = 0;
  this->DisplayStart = -1;
  this->DisplayEnd = -1;
  if (0.0 < items_height) {
    ImGui::CalcListClipping(count,items_height,&this->DisplayStart,&this->DisplayEnd);
    pIVar6 = GImGui;
    iVar3 = this->DisplayStart;
    if (0 < iVar3) {
      fVar1 = this->ItemsHeight;
      fVar8 = (float)iVar3 * fVar1 + this->StartPosY;
      pIVar4 = GImGui->CurrentWindow;
      (pIVar4->DC).CursorPos.y = fVar8;
      fVar2 = (pIVar4->DC).CursorMaxPos.y;
      uVar7 = -(uint)(fVar8 <= fVar2);
      (pIVar4->DC).CursorMaxPos.y = (float)(uVar7 & (uint)fVar2 | ~uVar7 & (uint)fVar8);
      (pIVar4->DC).CursorPosPrevLine.y = fVar8 - fVar1;
      (pIVar4->DC).PrevLineSize.y = fVar1 - (pIVar6->Style).ItemSpacing.y;
      pIVar5 = (pIVar4->DC).CurrentColumns;
      if (pIVar5 != (ImGuiColumns *)0x0) {
        pIVar5->LineMinY = fVar8;
      }
    }
    this->StepNo = 2;
  }
  return;
}

Assistant:

void ImGuiListClipper::Begin(int count, float items_height)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    StartPosY = window->DC.CursorPos.y;
    ItemsHeight = items_height;
    ItemsCount = count;
    StepNo = 0;
    DisplayEnd = DisplayStart = -1;
    if (ItemsHeight > 0.0f)
    {
        ImGui::CalcListClipping(ItemsCount, ItemsHeight, &DisplayStart, &DisplayEnd); // calculate how many to clip/display
        if (DisplayStart > 0)
            SetCursorPosYAndSetupDummyPrevLine(StartPosY + DisplayStart * ItemsHeight, ItemsHeight); // advance cursor
        StepNo = 2;
    }
}